

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O3

shared_ptr<Foo> __thiscall
squall::detail::Fetch<std::shared_ptr<Foo>,_(squall::detail::FetchContext)0>::doit
          (Fetch<std::shared_ptr<Foo>,_(squall::detail::FetchContext)0> *this,HSQUIRRELVM vm,
          SQInteger index)

{
  undefined8 *puVar1;
  long lVar2;
  long *in_RAX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Foo> sVar3;
  SQUserPointer r;
  long *local_28;
  
  local_28 = in_RAX;
  check_argument_type<(squall::detail::FetchContext)0>(vm,index,OT_USERDATA);
  sq_getuserdata(vm,index,&local_28,(SQUserPointer *)0x0);
  puVar1 = (undefined8 *)*local_28;
  *(undefined8 *)this = *puVar1;
  lVar2 = puVar1[1];
  *(long *)(this + 8) = lVar2;
  if (lVar2 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    }
  }
  sVar3.super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Foo>)sVar3.super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static T doit(HSQUIRRELVM vm, SQInteger index) {
        check_argument_type<FC>(vm, index, OT_USERDATA);
        SQUserPointer r;
        sq_getuserdata(vm, index, &r, NULL);
        return **((T**)r);
    }